

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_address.cpp
# Opt level: O0

Address * cfd::ElementsAddressFactory::CreatePegOutAddress
                    (NetType mainchain_network,NetType elements_network,string *descriptor_or_xpub,
                    uint32_t bip32_counter,AddressType address_type,Descriptor *base_descriptor)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  AddressType AVar2;
  undefined8 uVar3;
  long lVar4;
  string *in_RCX;
  NetType in_EDX;
  NetType in_ESI;
  Address *in_RDI;
  uint32_t in_R8D;
  int in_R9D;
  Descriptor *in_stack_00000008;
  AddressType addr_type;
  DescriptorScriptReference ref;
  ExtPubkey check_key;
  KeyData derived_key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string index_str;
  ExtPubkey pk;
  string extkey;
  size_type end_pos;
  size_type start_pos;
  Descriptor desc;
  string descriptor;
  Address *addr;
  DescriptorScriptReference *in_stack_fffffffffffff2c0;
  allocator *paVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff2c8;
  string *__lhs;
  undefined4 in_stack_fffffffffffff2d0;
  undefined4 in_stack_fffffffffffff2d4;
  CfdError in_stack_fffffffffffff2dc;
  CfdException *in_stack_fffffffffffff2e0;
  undefined4 in_stack_fffffffffffff2e8;
  uint in_stack_fffffffffffff2ec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff2f0;
  iterator in_stack_fffffffffffff2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff300;
  char *in_stack_fffffffffffff308;
  string *local_cd8;
  Descriptor local_c80;
  undefined1 local_b0a;
  allocator local_b09;
  string local_b08 [32];
  string local_ae8 [32];
  string local_ac8 [32];
  string local_aa8 [32];
  string local_a88 [32];
  string local_a68 [32];
  string local_a48 [36];
  AddressType local_a24;
  string local_a20;
  DescriptorScriptReference local_a00;
  undefined1 local_692;
  allocator local_691;
  string local_690 [32];
  Pubkey local_670;
  Pubkey local_658;
  string local_640;
  Extkey local_620;
  KeyData local_590;
  string *local_400;
  string local_3f8 [32];
  string *local_3d8;
  undefined8 local_3d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c8;
  string local_3b0 [32];
  Extkey local_390;
  string local_300;
  undefined8 local_2e0;
  long local_2d8;
  Descriptor local_2d0;
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0;
  undefined1 local_7a;
  allocator local_79;
  string local_78 [35];
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  int local_20;
  uint32_t local_1c;
  string *local_18;
  NetType local_10;
  NetType local_c;
  
  if (2 < (int)in_ESI) {
    local_55 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,"Failed to mainchain network type. invalid value.",&local_41);
    core::CfdException::CfdException
              (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2dc,
               (string *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0));
    local_55 = 0;
    __cxa_throw(uVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if ((2 < (int)in_EDX) && ((int)in_EDX < 6)) {
    local_20 = in_R9D;
    local_1c = in_R8D;
    local_18 = in_RCX;
    local_10 = in_EDX;
    local_c = in_ESI;
    std::__cxx11::string::string((string *)&local_a0,in_RCX);
    lVar4 = std::__cxx11::string::find((char *)local_18,0x8b1c1b);
    if (lVar4 == -1) {
      if (local_20 == 2) {
        std::operator+(in_stack_fffffffffffff308,in_stack_fffffffffffff300);
        std::operator+(in_stack_fffffffffffff2c8,(char *)in_stack_fffffffffffff2c0);
        std::__cxx11::string::operator=((string *)&local_a0,local_c0);
        std::__cxx11::string::~string(local_c0);
        std::__cxx11::string::~string(local_e0);
      }
      else if (local_20 == 6) {
        std::operator+(in_stack_fffffffffffff308,in_stack_fffffffffffff300);
        std::operator+(in_stack_fffffffffffff2c8,(char *)in_stack_fffffffffffff2c0);
        std::__cxx11::string::operator=((string *)&local_a0,local_100);
        std::__cxx11::string::~string(local_100);
        std::__cxx11::string::~string(local_120);
      }
      else if (local_20 == 4) {
        std::operator+(in_stack_fffffffffffff308,in_stack_fffffffffffff300);
        std::operator+(in_stack_fffffffffffff2c8,(char *)in_stack_fffffffffffff2c0);
        std::__cxx11::string::operator=((string *)&local_a0,local_140);
        std::__cxx11::string::~string(local_140);
        std::__cxx11::string::~string(local_160);
      }
    }
    core::Descriptor::Parse
              (&local_2d0,&local_a0,
               (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                *)0x0,kMainnet);
    lVar4 = std::__cxx11::string::find((char *)&local_a0,0x8a930f);
    if (lVar4 != -1) {
      local_2d8 = std::__cxx11::string::rfind((char *)&local_a0,0x8b1c1b);
      local_2d8 = local_2d8 + 1;
      local_2e0 = std::__cxx11::string::find((char *)&local_a0,0x8a930f);
      std::__cxx11::string::substr((ulong)&local_300,(ulong)&local_a0);
      core::ExtPubkey::ExtPubkey((ExtPubkey *)&local_390,&local_300);
      std::__cxx11::to_string(in_stack_fffffffffffff2ec);
      local_400 = local_3f8;
      std::__cxx11::string::string(local_400,local_3b0);
      local_3d8 = local_3f8;
      local_3d0 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x5796dc);
      __l._M_len = (size_type)in_stack_fffffffffffff300;
      __l._M_array = in_stack_fffffffffffff2f8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_fffffffffffff2f0,__l,
               (allocator_type *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x57970d);
      local_cd8 = (string *)&local_3d8;
      do {
        local_cd8 = local_cd8 + -0x20;
        std::__cxx11::string::~string(local_cd8);
      } while (local_cd8 != local_3f8);
      core::Descriptor::GetKeyData(&local_590,&local_2d0,&local_3c8);
      std::operator+(in_stack_fffffffffffff308,in_stack_fffffffffffff300);
      core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_620,(ExtPubkey *)&local_390,&local_640);
      std::__cxx11::string::~string((string *)&local_640);
      core::KeyData::GetPubkey(&local_658,&local_590);
      core::Extkey::GetPubkey(&local_670,&local_620);
      bVar1 = core::Pubkey::Equals(&local_658,&local_670);
      core::Pubkey::~Pubkey((Pubkey *)0x579813);
      core::Pubkey::~Pubkey((Pubkey *)0x579820);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        local_692 = 1;
        uVar3 = __cxa_allocate_exception(0x30);
        paVar5 = &local_691;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_690,"Invalid descriptor format. This path is not support on pegout.",paVar5
                  );
        core::CfdException::CfdException
                  (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2dc,
                   (string *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0));
        local_692 = 0;
        __cxa_throw(uVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      core::Descriptor::GetReference(&local_a00,&local_2d0,&local_3c8);
      core::Extkey::ToString_abi_cxx11_(&local_a20,&local_390);
      __lhs = &local_a20;
      std::__cxx11::string::operator=((string *)&local_a0,(string *)__lhs);
      std::__cxx11::string::~string((string *)__lhs);
      AVar2 = core::DescriptorScriptReference::GetAddressType(&local_a00);
      local_a24 = AVar2;
      if (AVar2 == kP2pkhAddress) {
        std::operator+(in_stack_fffffffffffff308,in_stack_fffffffffffff300);
        std::operator+(__lhs,(char *)in_stack_fffffffffffff2c0);
        std::__cxx11::string::operator=((string *)&local_a0,local_a48);
        std::__cxx11::string::~string(local_a48);
        std::__cxx11::string::~string(local_a68);
      }
      else if (AVar2 == kP2shP2wpkhAddress) {
        std::operator+(in_stack_fffffffffffff308,in_stack_fffffffffffff300);
        std::operator+(__lhs,(char *)in_stack_fffffffffffff2c0);
        std::__cxx11::string::operator=((string *)&local_a0,local_a88);
        std::__cxx11::string::~string(local_a88);
        std::__cxx11::string::~string(local_aa8);
      }
      else {
        if (AVar2 != kP2wpkhAddress) {
          local_b0a = 1;
          uVar3 = __cxa_allocate_exception(0x30);
          paVar5 = &local_b09;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_b08,"Invalid descriptor. This descriptor type isn\'t support on pegout.",
                     paVar5);
          core::CfdException::CfdException
                    (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2dc,
                     (string *)CONCAT44(AVar2,in_stack_fffffffffffff2d0));
          local_b0a = 0;
          __cxa_throw(uVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
        std::operator+(in_stack_fffffffffffff308,in_stack_fffffffffffff300);
        std::operator+(__lhs,(char *)in_stack_fffffffffffff2c0);
        std::__cxx11::string::operator=((string *)&local_a0,local_ac8);
        std::__cxx11::string::~string(local_ac8);
        std::__cxx11::string::~string(local_ae8);
      }
      core::Descriptor::Parse
                (&local_c80,&local_a0,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0,kMainnet);
      core::Descriptor::operator=(&local_2d0,&local_c80);
      core::Descriptor::~Descriptor((Descriptor *)0x579e70);
      core::DescriptorScriptReference::~DescriptorScriptReference(in_stack_fffffffffffff2c0);
      core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x579e8a);
      core::KeyData::~KeyData((KeyData *)in_stack_fffffffffffff2c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(AVar2,in_stack_fffffffffffff2d0));
      std::__cxx11::string::~string(local_3b0);
      core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x579ebe);
      std::__cxx11::string::~string((string *)&local_300);
    }
    core::ConfidentialTransaction::GetPegoutAddressFromDescriptor
              (in_RDI,&local_a0,local_1c,local_c,local_10);
    if (in_stack_00000008 != (Descriptor *)0x0) {
      core::Descriptor::operator=(in_stack_00000008,&local_2d0);
    }
    core::Descriptor::~Descriptor((Descriptor *)0x579ff9);
    std::__cxx11::string::~string((string *)&local_a0);
    return in_RDI;
  }
  local_7a = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"Failed to elements network type. invalid value.",&local_79)
  ;
  core::CfdException::CfdException
            (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2dc,
             (string *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0));
  local_7a = 0;
  __cxa_throw(uVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

Address ElementsAddressFactory::CreatePegOutAddress(
    NetType mainchain_network, NetType elements_network,
    const std::string& descriptor_or_xpub, uint32_t bip32_counter,
    AddressType address_type, Descriptor* base_descriptor) {
  if (mainchain_network > NetType::kRegtest) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to mainchain network type. invalid value.");
  }
  if ((elements_network < NetType::kLiquidV1) ||
      (elements_network > NetType::kCustomChain)) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to elements network type. invalid value.");
  }

  std::string descriptor = descriptor_or_xpub;
  if (descriptor_or_xpub.find("(") == std::string::npos) {
    if (address_type == AddressType::kP2pkhAddress) {
      descriptor = "pkh(" + descriptor_or_xpub + ")";
    } else if (address_type == AddressType::kP2shP2wpkhAddress) {
      descriptor = "sh(wpkh(" + descriptor_or_xpub + "))";
    } else if (address_type == AddressType::kP2wpkhAddress) {
      descriptor = "wpkh(" + descriptor_or_xpub + ")";
    }
  }

  auto desc = Descriptor::Parse(descriptor);
  if (descriptor.find("/") != std::string::npos) {
    auto start_pos = descriptor.rfind("(") + 1;
    auto end_pos = descriptor.find("/");
    std::string extkey = descriptor.substr(start_pos, end_pos - start_pos);
    ExtPubkey pk(extkey);
    auto index_str = std::to_string(bip32_counter);
    std::vector<std::string> args = {index_str};
    auto derived_key = desc.GetKeyData(args);
    auto check_key = pk.DerivePubkey("0/" + index_str);
    if (!derived_key.GetPubkey().Equals(check_key.GetPubkey())) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid descriptor format. This path is not support on pegout.");
    }

    auto ref = desc.GetReference(&args);
    descriptor = pk.ToString();
    auto addr_type = ref.GetAddressType();
    if (addr_type == AddressType::kP2pkhAddress) {
      descriptor = "pkh(" + descriptor + ")";
    } else if (addr_type == AddressType::kP2shP2wpkhAddress) {
      descriptor = "sh(wpkh(" + descriptor + "))";
    } else if (addr_type == AddressType::kP2wpkhAddress) {
      descriptor = "wpkh(" + descriptor + ")";
    } else {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid descriptor. This descriptor type isn't support on pegout.");
    }
    desc = Descriptor::Parse(descriptor);
  }

  auto addr = ConfidentialTransaction::GetPegoutAddressFromDescriptor(
      descriptor, bip32_counter, mainchain_network, elements_network);
  if (base_descriptor != nullptr) *base_descriptor = desc;
  return addr;
}